

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

int __thiscall kj::File::copy(File *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ReadableFile *pRVar3;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long_&>_> size;
  uint64_t in_RCX;
  unsigned_long in_R8;
  ArrayPtr<unsigned_char> local_2080;
  ArrayPtr<const_unsigned_char> local_2070;
  unsigned_long local_2060;
  ArrayPtr<unsigned_char> local_2058;
  size_t local_2048;
  size_t n;
  size_t result;
  byte buffer [8192];
  unsigned_long local_30;
  uint64_t size_local;
  uint64_t fromOffset_local;
  ReadableFile *from_local;
  uint64_t offset_local;
  File *this_local;
  
  n = 0;
  size_local = in_RCX;
  fromOffset_local = (uint64_t)src;
  from_local = (ReadableFile *)dst;
  offset_local = (uint64_t)this;
  for (local_30 = in_R8; uVar2 = fromOffset_local, uVar1 = size_local, local_30 != 0;
      local_30 = local_30 - local_2048) {
    local_2060 = 0x2000;
    size = min<unsigned_long,unsigned_long&>(&local_2060,&local_30);
    local_2058 = arrayPtr<unsigned_char>((uchar *)&result,size);
    local_2048 = (**(code **)(*(long *)uVar2 + 0x30))(uVar2,uVar1,local_2058.ptr,local_2058.size_);
    pRVar3 = from_local;
    local_2080 = arrayPtr<unsigned_char>((uchar *)&result,local_2048);
    local_2070 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_2080);
    (*(this->super_ReadableFile).super_FsNode._vptr_FsNode[9])
              (this,pRVar3,local_2070.ptr,local_2070.size_);
    n = local_2048 + n;
    if (local_2048 < 0x2000) break;
    size_local = local_2048 + size_local;
    from_local = (ReadableFile *)((long)&(from_local->super_FsNode)._vptr_FsNode + local_2048);
  }
  return (int)n;
}

Assistant:

size_t File::copy(uint64_t offset, const ReadableFile& from,
                  uint64_t fromOffset, uint64_t size) const {
  byte buffer[8192];

  size_t result = 0;
  while (size > 0) {
    size_t n = from.read(fromOffset, kj::arrayPtr(buffer, kj::min(sizeof(buffer), size)));
    write(offset, arrayPtr(buffer, n));
    result += n;
    if (n < sizeof(buffer)) {
      // Either we copied the amount requested or we hit EOF.
      break;
    }
    fromOffset += n;
    offset += n;
    size -= n;
  }

  return result;
}